

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerCoerseStrOrRegex(Lowerer *this,Instr *instr)

{
  bool bVar1;
  Lowerer *baseOpnd;
  LabelInstr *labelTarget;
  LabelInstr *target;
  Opnd *compareSrc2;
  IndirOpnd *compareSrc1;
  Lowerer *this_00;
  
  baseOpnd = (Lowerer *)IR::Opnd::AsRegOpnd(instr->m_src1);
  labelTarget = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  bVar1 = IR::Opnd::IsNotTaggedValue((Opnd *)baseOpnd);
  if (!bVar1) {
    LowererMD::GenerateObjectTest(&this->m_lowererMD,(Opnd *)baseOpnd,instr,labelTarget,false);
  }
  compareSrc2 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
  this_00 = baseOpnd;
  compareSrc1 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0,TyUint64,instr->m_func,false);
  InsertCompareBranch(this_00,&compareSrc1->super_Opnd,compareSrc2,BrNeq_A,labelTarget,instr,false);
  InsertMove(instr->m_dst,(Opnd *)baseOpnd,instr,true);
  InsertBranch(Br,target,instr);
  IR::Instr::InsertBefore(instr,&labelTarget->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  LowerConvStr(this,instr);
  return;
}

Assistant:

void
Lowerer::LowerCoerseStrOrRegex(IR::Instr* instr)
{
    IR::RegOpnd * src1Opnd = instr->GetSrc1()->AsRegOpnd();

    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    // if (value == regex) goto :done
    if (!src1Opnd->IsNotTaggedValue())
    {
        this->m_lowererMD.GenerateObjectTest(src1Opnd, instr, helperLabel);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    InsertCompareBranch(IR::IndirOpnd::New(src1Opnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd, Js::OpCode::BrNeq_A, helperLabel, instr);

    InsertMove(instr->GetDst(), src1Opnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);

    // helper: ConvStr value
    LowerConvStr(instr);
}